

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numbers.cc
# Opt level: O0

uint64_t absl::lts_20250127::anon_unknown_0::PrepareEightDigits(uint32_t i)

{
  long lVar1;
  ulong uVar2;
  uint64_t tens;
  uint64_t hundreds;
  uint64_t mod100;
  uint64_t div100;
  uint64_t merged;
  uint32_t lo;
  uint32_t hi;
  uint32_t i_local;
  
  if (i < 100000000) {
    lVar1 = CONCAT44(i % 10000,i / 10000);
    uVar2 = (ulong)(lVar1 * 0x28f6) >> 0x14 & 0x7f0000007f;
    lVar1 = (lVar1 + uVar2 * -100) * 0x10000 + uVar2;
    uVar2 = (ulong)(lVar1 * 0x67) >> 10 & 0xf000f000f000f;
    return (lVar1 + uVar2 * -10) * 0x100 + uVar2;
  }
  __assert_fail("i < 10000\'0000",
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/absl-src/absl/strings/numbers.cc"
                ,0xde,
                "uint64_t absl::lts_20250127::(anonymous namespace)::PrepareEightDigits(uint32_t)");
}

Assistant:

inline uint64_t PrepareEightDigits(uint32_t i) {
  ABSL_ASSUME(i < 10000'0000);
  // Prepare 2 blocks of 4 digits "in parallel".
  uint32_t hi = i / 10000;
  uint32_t lo = i % 10000;
  uint64_t merged = hi | (uint64_t{lo} << 32);
  uint64_t div100 = ((merged * kDivisionBy100Mul) / kDivisionBy100Div) &
                    ((0x7Full << 32) | 0x7Full);
  uint64_t mod100 = merged - 100ull * div100;
  uint64_t hundreds = (mod100 << 16) + div100;
  uint64_t tens = (hundreds * kDivisionBy10Mul) / kDivisionBy10Div;
  tens &= (0xFull << 48) | (0xFull << 32) | (0xFull << 16) | 0xFull;
  tens += (hundreds - 10ull * tens) << 8;
  return tens;
}